

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 CalcSizeAutoFit(ImGuiWindow *window,ImVec2 *size_contents)

{
  float fVar1;
  ImGuiContext *pIVar2;
  byte bVar3;
  byte bVar4;
  ImGuiContext *g;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ImVec2 new_size;
  ImVec2 IVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  pIVar2 = GImGui;
  fVar6 = 0.0;
  if ((window->Flags & 1) == 0) {
    fVar6 = GImGui->FontBaseSize * window->FontWindowScale;
    if (window->ParentWindow != (ImGuiWindow *)0x0) {
      fVar6 = fVar6 * window->ParentWindow->FontWindowScale;
    }
    fVar12 = (GImGui->Style).FramePadding.y;
    fVar6 = fVar12 + fVar12 + fVar6;
  }
  fVar7 = ImGuiWindow::MenuBarHeight(window);
  fVar12 = (window->WindowPadding).x;
  fVar12 = fVar12 + fVar12;
  fVar10 = (window->WindowPadding).y;
  fVar10 = fVar10 + fVar10;
  fVar8 = size_contents->x + fVar12;
  fVar16 = size_contents->y + fVar10 + fVar7 + fVar6;
  if (((uint)window->Flags >> 0x19 & 1) == 0) {
    fVar11 = (pIVar2->Style).WindowMinSize.x;
    fVar15 = (pIVar2->Style).WindowMinSize.y;
    if ((window->Flags & 0x14000000U) != 0) {
      if (4.0 <= fVar11) {
        fVar11 = 4.0;
      }
      if (4.0 <= fVar15) {
        fVar15 = 4.0;
      }
    }
    fVar13 = (pIVar2->Style).DisplaySafeAreaPadding.x;
    fVar1 = (pIVar2->Style).DisplaySafeAreaPadding.y;
    fVar13 = (pIVar2->IO).DisplaySize.x - (fVar13 + fVar13);
    fVar14 = (pIVar2->IO).DisplaySize.y - (fVar1 + fVar1);
    uVar5 = -(uint)(fVar13 <= fVar11);
    fVar1 = (float)(uVar5 & (uint)fVar11 | ~uVar5 & (uint)fVar13);
    uVar5 = -(uint)(fVar14 <= fVar15);
    fVar13 = (float)(uVar5 & (uint)fVar15 | ~uVar5 & (uint)fVar14);
    if (fVar16 <= fVar13) {
      fVar13 = fVar16;
    }
    fVar16 = (float)(-(uint)(fVar16 < fVar15) & (uint)fVar15 |
                    ~-(uint)(fVar16 < fVar15) & (uint)fVar13);
    uVar5 = -(uint)(fVar1 < fVar8);
    new_size.x = (float)(-(uint)(fVar8 < fVar11) & (uint)fVar11 |
                        ~-(uint)(fVar8 < fVar11) &
                        (~uVar5 & (uint)(fVar8 + 0.0) | uVar5 & (uint)fVar1));
    new_size.y = fVar16;
    IVar9 = CalcSizeAfterConstraint(window,new_size);
    if ((size_contents->x <= IVar9.x - fVar12) || (bVar3 = 1, (window->Flags & 0x808U) != 0x800)) {
      bVar3 = *(byte *)((long)&window->Flags + 1) >> 7;
    }
    if ((size_contents->y <= (IVar9.y - fVar10) - (fVar7 + fVar6)) ||
       (bVar4 = 1, (window->Flags & 8) != 0)) {
      bVar4 = (*(byte *)((long)&window->Flags + 1) & 0x40) >> 6;
    }
    if (bVar3 != 0) {
      new_size.y = fVar16 + (pIVar2->Style).ScrollbarSize;
    }
    if (bVar4 != 0) {
      new_size.y = new_size.y;
      new_size.x = new_size.x + (pIVar2->Style).ScrollbarSize;
    }
  }
  else {
    new_size.y = fVar16;
    new_size.x = fVar8 + 0.0;
  }
  return new_size;
}

Assistant:

static ImVec2 CalcSizeAutoFit(ImGuiWindow* window, const ImVec2& size_contents)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    ImVec2 size_decorations = ImVec2(0.0f, window->TitleBarHeight() + window->MenuBarHeight());
    ImVec2 size_pad = window->WindowPadding * 2.0f;
    ImVec2 size_desired = size_contents + size_pad + size_decorations;
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Tooltip always resize
        return size_desired;
    }
    else
    {
        // Maximum window size is determined by the viewport size or monitor size
        const bool is_popup = (window->Flags & ImGuiWindowFlags_Popup) != 0;
        const bool is_menu = (window->Flags & ImGuiWindowFlags_ChildMenu) != 0;
        ImVec2 size_min = style.WindowMinSize;
        if (is_popup || is_menu) // Popups and menus bypass style.WindowMinSize by default, but we give then a non-zero minimum size to facilitate understanding problematic cases (e.g. empty popups)
            size_min = ImMin(size_min, ImVec2(4.0f, 4.0f));
        ImVec2 size_auto_fit = ImClamp(size_desired, size_min, ImMax(size_min, g.IO.DisplaySize - style.DisplaySafeAreaPadding * 2.0f));

        // When the window cannot fit all contents (either because of constraints, either because screen is too small),
        // we are growing the size on the other axis to compensate for expected scrollbar. FIXME: Might turn bigger than ViewportSize-WindowPadding.
        ImVec2 size_auto_fit_after_constraint = CalcSizeAfterConstraint(window, size_auto_fit);
        bool will_have_scrollbar_x = (size_auto_fit_after_constraint.x - size_pad.x - size_decorations.x < size_contents.x && !(window->Flags & ImGuiWindowFlags_NoScrollbar) && (window->Flags & ImGuiWindowFlags_HorizontalScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysHorizontalScrollbar);
        bool will_have_scrollbar_y = (size_auto_fit_after_constraint.y - size_pad.y - size_decorations.y < size_contents.y && !(window->Flags & ImGuiWindowFlags_NoScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysVerticalScrollbar);
        if (will_have_scrollbar_x)
            size_auto_fit.y += style.ScrollbarSize;
        if (will_have_scrollbar_y)
            size_auto_fit.x += style.ScrollbarSize;
        return size_auto_fit;
    }
}